

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

bool __thiscall duckdb::RowGroup::IsPersistent(RowGroup *this)

{
  shared_ptr<duckdb::ColumnData,_true> *psVar1;
  char cVar2;
  int iVar3;
  ColumnData *pCVar4;
  shared_ptr<duckdb::ColumnData,_true> *this_00;
  bool bVar5;
  
  this_00 = (this->columns).
            super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
            .
            super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->columns).
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = this_00 == psVar1;
  if (!bVar5) {
    pCVar4 = shared_ptr<duckdb::ColumnData,_true>::operator->(this_00);
    iVar3 = (*pCVar4->_vptr_ColumnData[0x1e])(pCVar4);
    cVar2 = (char)iVar3;
    while (cVar2 != '\0') {
      this_00 = this_00 + 1;
      bVar5 = this_00 == psVar1;
      if (bVar5) {
        return bVar5;
      }
      pCVar4 = shared_ptr<duckdb::ColumnData,_true>::operator->(this_00);
      iVar3 = (*pCVar4->_vptr_ColumnData[0x1e])(pCVar4);
      cVar2 = (char)iVar3;
    }
  }
  return bVar5;
}

Assistant:

RowGroupPointer RowGroup::Checkpoint(RowGroupWriteData write_data, RowGroupWriter &writer,
                                     TableStatistics &global_stats) {
	RowGroupPointer row_group_pointer;

	auto lock = global_stats.GetLock();
	for (idx_t column_idx = 0; column_idx < GetColumnCount(); column_idx++) {
		global_stats.GetStats(*lock, column_idx).Statistics().Merge(write_data.statistics[column_idx]);
	}

	// construct the row group pointer and write the column meta data to disk
	D_ASSERT(write_data.states.size() == columns.size());
	row_group_pointer.row_start = start;
	row_group_pointer.tuple_count = count;
	for (auto &state : write_data.states) {
		// get the current position of the table data writer
		auto &data_writer = writer.GetPayloadWriter();
		auto pointer = data_writer.GetMetaBlockPointer();

		// store the stats and the data pointers in the row group pointers
		row_group_pointer.data_pointers.push_back(pointer);

		// Write pointers to the column segments.
		//
		// Just as above, the state can refer to many other states, so this
		// can cascade recursively into more pointer writes.
		auto persistent_data = state->ToPersistentData();
		BinarySerializer serializer(data_writer);
		serializer.Begin();
		persistent_data.Serialize(serializer);
		serializer.End();
	}
	row_group_pointer.deletes_pointers = CheckpointDeletes(writer.GetPayloadWriter().GetManager());
	Verify();
	return row_group_pointer;
}